

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O2

void __thiscall
BaseIndex::FatalErrorf<char[15],std::__cxx11::string>
          (BaseIndex *this,char *fmt,char (*args) [15],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  SignalInterrupt *shutdown;
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  long in_FS_OFFSET;
  string message;
  string in_stack_ffffffffffffff58;
  bilingual_str local_80;
  string local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  tinyformat::format<char[15],std::__cxx11::string>
            (&local_40,(tinyformat *)fmt,*args,(char (*) [15])args_1,in_R8);
  iVar1 = (*((this->m_chain)._M_t.
             super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t.
             super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
             super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl)->_vptr_Chain[0x36])();
  shutdown = *(SignalInterrupt **)(CONCAT44(extraout_var,iVar1) + 0x18);
  iVar1 = (*((this->m_chain)._M_t.
             super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t.
             super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
             super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl)->_vptr_Chain[0x36])();
  std::__cxx11::string::string((string *)&stack0xffffffffffffff60,&local_40);
  Untranslated(&local_80,in_stack_ffffffffffffff58);
  iVar2 = (*((this->m_chain)._M_t.
             super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t.
             super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
             super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl)->_vptr_Chain[0x36])();
  ::node::AbortNode(shutdown,(atomic<int> *)(CONCAT44(extraout_var_00,iVar1) + 0xe8),&local_80,
                    *(Warnings **)(CONCAT44(extraout_var_01,iVar2) + 0xf0));
  bilingual_str::~bilingual_str(&local_80);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff60);
  std::__cxx11::string::~string((string *)&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void BaseIndex::FatalErrorf(const char* fmt, const Args&... args)
{
    auto message = tfm::format(fmt, args...);
    node::AbortNode(m_chain->context()->shutdown, m_chain->context()->exit_status, Untranslated(message), m_chain->context()->warnings.get());
}